

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<double>::Subst_LBackward(TPZMatrix<double> *this,TPZFMatrix<double> *B)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double local_38;
  
  lVar3 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar3 != CONCAT44(extraout_var,iVar2)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LBackward incompatible dimensions \n",(char *)0x0);
  }
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar2) != 0 && -1 < extraout_var_00) {
    lVar3 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    lVar4 = CONCAT44(extraout_var_00,iVar2);
    do {
      lVar5 = lVar4 + -1;
      if (0 < lVar3) {
        lVar6 = 0;
        do {
          iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
          lVar3 = CONCAT44(extraout_var_01,iVar2);
          dVar7 = 0.0;
          while (lVar4 < lVar3) {
            lVar3 = lVar3 + -1;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar3)
            ;
            (*(B->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x24])(B,lVar3,lVar6);
            dVar7 = dVar7 + extraout_XMM0_Qa_00 * extraout_XMM0_Qa;
          }
          (*(B->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
          )(B,lVar5,lVar6);
          local_38 = extraout_XMM0_Qa_01 - dVar7;
          (*(B->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23]
          )(B,lVar5,lVar6,&local_38);
          lVar6 = lVar6 + 1;
          lVar3 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
        } while (lVar6 < lVar3);
      }
      bVar1 = 1 < lVar4;
      lVar4 = lVar5;
    } while (bVar1);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt){
		Error("TPZMatrix::Subst_LBackward incompatible dimensions \n");
	}
	
    for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
        for ( int64_t c = 0; c < B->Cols(); c++ ) {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
            //
            TVar sum = 0.0;
            for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = B[r,c] - sum.
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}